

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
CanStorePropertyValueDirectly
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId,bool allowLetConst)

{
  code *pcVar1;
  _func_int **pp_Var2;
  bool bVar3;
  undefined4 *puVar4;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  
  if (propertyId == -1) {
    bVar3 = true;
  }
  else {
    local_28 = ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
    bVar3 = JsUtil::
            BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
            ::TryGetReference<Js::PropertyRecord_const*>
                      ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                        *)(this->propertyMap).ptr,&local_28,
                       (SimpleDictionaryPropertyDescriptor<int> **)&propertyRecord);
    if (bVar3) {
      pp_Var2 = (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject;
      if (allowLetConst) {
        if (((ulong)pp_Var2 & 0x1000) != 0) {
          return true;
        }
      }
      else if (((ulong)pp_Var2 & 0x1000) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0xbd2,"(!(descriptor->Attributes & 0x10))",
                                    "Asking about a global property this type handler doesn\'t have?"
                                   );
        if (!bVar3) goto LAB_00c6e556;
        *puVar4 = 0;
      }
      bVar3 = ((ulong)(propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject & 6) == 2;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0xbd8,"(false)",
                                  "Asking about a property this type handler doesn\'t know about?");
      if (!bVar3) {
LAB_00c6e556:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::CanStorePropertyValueDirectly(const DynamicObject* instance, PropertyId propertyId, bool allowLetConst)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;

        // We pass Constants::NoProperty for ActivationObjects for functions with same named formals.
        if (propertyId == Constants::NoProperty)
        {
            return true;
        }

        PropertyRecord const* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if (allowLetConst && (descriptor->Attributes & PropertyLetConstGlobal))
            {
                return true;
            }
            else
            {
                AssertMsg(!(descriptor->Attributes & PropertyLetConstGlobal), "Asking about a global property this type handler doesn't have?");
                return !descriptor->IsOrMayBecomeFixed();
            }
        }
        else
        {
            AssertMsg(false, "Asking about a property this type handler doesn't know about?");
            return false;
        }
    }